

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

_Bool player_set_timed(player *p,wchar_t idx,wchar_t v,_Bool notify,_Bool can_disturb)

{
  wchar_t wVar1;
  int flag;
  player_upkeep *ppVar2;
  bool bVar3;
  _Bool _Var4;
  wchar_t wVar5;
  object *obj;
  undefined7 extraout_var;
  object *obj_00;
  undefined7 extraout_var_00;
  int16_t *piVar6;
  undefined7 in_register_00000009;
  timed_effect_data *ptVar7;
  undefined7 in_register_00000081;
  _Bool *ident_00;
  char cVar8;
  undefined4 uVar9;
  timed_grade *ptVar10;
  ulong uVar11;
  effect *effect;
  timed_grade *ptVar12;
  source origin;
  source sVar13;
  _Bool ident_1;
  _Bool ident;
  undefined4 local_64;
  ulong local_60;
  timed_effect_data *local_58;
  undefined4 local_50;
  bitflag collect_f [5];
  bitflag f [5];
  
  if (idx < L'\0') {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x316,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  local_64 = (undefined4)CONCAT71(in_register_00000009,notify);
  local_50 = (undefined4)CONCAT71(in_register_00000081,can_disturb);
  if (0x34 < (uint)idx) {
    __assert_fail("idx < TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x317,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  uVar11 = (ulong)(uint)idx;
  ptVar10 = timed_effects[uVar11].grade;
  obj = equipped_item_by_slot_name(p,"weapon");
  if (v < timed_effects[uVar11].lower_bound) {
    v = timed_effects[uVar11].lower_bound;
  }
  wVar5 = (wchar_t)p->timed[uVar11];
  if (v == wVar5) {
    return false;
  }
  ptVar7 = timed_effects + uVar11;
  ptVar12 = ptVar10;
  do {
    if (v <= ptVar12->max) break;
    ptVar12 = ptVar12->next;
  } while (ptVar12->next != (timed_grade *)0x0);
  do {
    if (wVar5 <= ptVar10->max) break;
    ptVar10 = ptVar10->next;
  } while (ptVar10->next != (timed_grade *)0x0);
  wVar1 = ptVar12->max;
  if ((wVar1 < v) && (v = wVar1, wVar1 == wVar5)) {
    return false;
  }
  wVar5 = timed_effects[uVar11].temp_resist;
  local_60 = uVar11;
  if (((long)wVar5 != -1) && (p->obj_k->el_info[wVar5].res_level != 0)) {
    _Var4 = player_is_immune(p,wVar5);
    local_64 = (undefined4)CONCAT71(extraout_var,~_Var4 & (byte)local_64);
  }
  local_58 = ptVar7;
  if (((timed_effects[uVar11].oflag_syn == true) && (timed_effects[uVar11].oflag_dup != 0)) &&
     (_Var4 = flag_has_dbg(p->obj_k->flags,5,timed_effects[uVar11].oflag_dup,"p->obj_k->flags",
                           "timed_effects[idx].oflag_dup"), _Var4)) {
    flag = timed_effects[uVar11].oflag_dup;
    player_flags(p,collect_f);
    if ((p->body).count != 0) {
      wVar5 = L'\0';
      do {
        obj_00 = slot_object(p,wVar5);
        if (obj_00 != (object *)0x0) {
          object_flags(obj_00,f);
          flag_union(collect_f,f,5);
        }
        wVar5 = wVar5 + L'\x01';
      } while ((uint)wVar5 < (uint)(p->body).count);
    }
    _Var4 = flag_has_dbg(collect_f,5,flag,"collect_f","flag");
    local_64 = (undefined4)CONCAT71(extraout_var_00,!_Var4 & (byte)local_64);
    ptVar7 = local_58;
  }
  uVar9 = local_50;
  uVar11 = local_60;
  if (ptVar10->grade < ptVar12->grade) {
    print_custom_message(obj,ptVar12->up_msg,ptVar7->msgt,p);
    bVar3 = true;
    uVar11 = local_60;
    uVar9 = local_50;
LAB_001a962d:
    cVar8 = (char)uVar9;
    if (v < L'\x01') {
      if (v == L'\0') goto LAB_001a96ab;
      goto LAB_001a96ca;
    }
    piVar6 = p->timed;
    if (piVar6[uVar11] == 0) {
      effect = local_58->on_begin_effect;
      if (effect == (effect *)0x0) goto LAB_001a96ca;
      ident = false;
      if (cVar8 == '\0') {
        sVar13 = source_player();
      }
      else {
        sVar13 = source_none();
      }
      ident_00 = &ident;
      goto LAB_001a96fa;
    }
  }
  else {
    if ((ptVar12->grade < ptVar10->grade) && (ptVar12->down_msg != (char *)0x0)) {
      print_custom_message(obj,ptVar12->down_msg,ptVar7->msgt,p);
      bVar3 = true;
      uVar11 = local_60;
      goto LAB_001a962d;
    }
    if ((byte)local_64 == '\0') {
      bVar3 = false;
      goto LAB_001a962d;
    }
    if (v != L'\0') {
      if ((v < p->timed[local_60]) && (ptVar7->on_decrease != (char *)0x0)) {
        print_custom_message(obj,ptVar7->on_decrease,ptVar7->msgt,p);
        bVar3 = true;
      }
      else {
        bVar3 = true;
        if ((p->timed[local_60] < v) && (local_58->on_increase != (char *)0x0)) {
          print_custom_message(obj,local_58->on_increase,local_58->msgt,p);
        }
      }
      goto LAB_001a962d;
    }
    print_custom_message(obj,ptVar7->on_end,L'5',p);
    bVar3 = true;
LAB_001a96ab:
    cVar8 = (char)uVar9;
    effect = local_58->on_end_effect;
    if (effect != (effect *)0x0) {
      ident_1 = false;
      if (cVar8 == '\0') {
        sVar13 = source_player();
      }
      else {
        sVar13 = source_none();
      }
      ident_00 = &ident_1;
LAB_001a96fa:
      origin.which = sVar13.which;
      origin._4_4_ = 0;
      origin.what = sVar13.what;
      effect_do(effect,origin,(object *)0x0,ident_00,true,L'\0',L'\0',L'\0',(command *)0x0);
      p->timed[local_60] = (int16_t)v;
      if (!bVar3) {
        return false;
      }
      goto LAB_001a972b;
    }
LAB_001a96ca:
    piVar6 = p->timed;
  }
  piVar6[uVar11] = (int16_t)v;
  if (!bVar3) {
    return false;
  }
LAB_001a972b:
  if (cVar8 != '\0') {
    disturb(p);
  }
  ppVar2 = p->upkeep;
  ppVar2->update = ppVar2->update | local_58->flag_update;
  ppVar2->redraw = local_58->flag_redraw | ppVar2->redraw | 0x2000;
  handle_stuff(p);
  return true;
}

Assistant:

bool player_set_timed(struct player *p, int idx, int v, bool notify,
		bool can_disturb)
{
	assert(idx >= 0);
	assert(idx < TMD_MAX);

	struct timed_effect_data *effect = &timed_effects[idx];
	struct timed_grade *new_grade = effect->grade;
	struct timed_grade *current_grade = effect->grade;
	struct object *weapon = equipped_item_by_slot_name(p, "weapon");

	/* Lower bound */
	v = MAX(v, effect->lower_bound);

	/* No change */
	if (p->timed[idx] == v) {
		return false;
	}

	/* Find the grade we will be going to, and the current one */
	while (v > new_grade->max) {
		new_grade = new_grade->next;
		if (!new_grade->next) break;
	}
	while (p->timed[idx] > current_grade->max) {
		current_grade = current_grade->next;
		if (!current_grade->next) break;
	}

	/* Upper bound */
	if (v > new_grade->max) {
		if (p->timed[idx] == new_grade->max) {
			/*
			 * No change:  tried to exceed the maximum possible and
			 * already there
			 */
			return false;
		}
		v = new_grade->max;
	}

	/* Don't mention effects which already match the known player state. */
	if (timed_effects[idx].temp_resist != -1 &&
			p->obj_k->el_info[timed_effects[idx].temp_resist].res_level &&
			player_is_immune(p, timed_effects[idx].temp_resist)) {
		notify = false;
	}
	if (timed_effects[idx].oflag_syn &&
			timed_effects[idx].oflag_dup != OF_NONE &&
			of_has(p->obj_k->flags, timed_effects[idx].oflag_dup) &&
			player_of_has_not_timed(p, timed_effects[idx].oflag_dup)) {
		notify = false;
	}

	/* Always mention going up a grade, otherwise on request */
	if (new_grade->grade > current_grade->grade) {
		print_custom_message(weapon, new_grade->up_msg,
			effect->msgt, p);
		notify = true;
	} else if ((new_grade->grade < current_grade->grade) &&
			(new_grade->down_msg)) {
		print_custom_message(weapon, new_grade->down_msg,
			effect->msgt, p);
		notify = true;
	} else if (notify) {
		if (v == 0) {
			/* Finishing */
			print_custom_message(weapon, effect->on_end,
				MSG_RECOVER, p);
		} else if (p->timed[idx] > v && effect->on_decrease) {
			/* Decrementing */
			print_custom_message(weapon, effect->on_decrease,
				effect->msgt, p);
		} else if (v > p->timed[idx] && effect->on_increase) {
			/* Incrementing */
			print_custom_message(weapon, effect->on_increase,
				effect->msgt, p);
		}
	}

	/*
	 * Dispatch effects for transitions.  Use source_player() as the
	 * origin if can_disturb is not true; otherwise, use source_none().
	 * That way any TIMED_INC or TIMED_INC_NO_RES effects in the effect
	 * chains will honor can_disturb.
	 */
	if (v > 0 && !p->timed[idx]) {
		/* The effect starts. */
		if (effect->on_begin_effect) {
			bool ident = false;

			(void) effect_do(effect->on_begin_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	} else if (v == 0) {
		/* The effect lapses. */
		if (effect->on_end_effect) {
			bool ident = false;

			(void) effect_do(effect->on_end_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	}

	/* Use the value */
	p->timed[idx] = v;

	if (notify) {
		/* Disturb */
		if (can_disturb) {
			disturb(p);
		}

		/* Update the visuals, as appropriate. */
		p->upkeep->update |= effect->flag_update;
		p->upkeep->redraw |= (PR_STATUS | effect->flag_redraw);

		/* Handle stuff */
		handle_stuff(p);
	}

	return notify;
}